

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O0

void __thiscall CGameClient::StartRendering(CGameClient *this)

{
  bool bVar1;
  CConfig *pCVar2;
  IGraphics *pIVar3;
  CGameClient *in_RDI;
  long in_FS_OFFSET;
  float fVar4;
  float ScreenWidth;
  float ScreenHeight;
  CQuadItem QuadItem;
  vec4 Top;
  vec4 Bottom;
  CGameClient *this_00;
  CQuadItem local_38;
  vector4_base<float> local_28;
  vector4_base<float> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pCVar2 = Config(in_RDI);
  if (pCVar2->m_GfxClear == 0) {
    bVar1 = CMenus::IsBackgroundNeeded((CMenus *)this_00);
    if (bVar1) {
      Graphics(in_RDI);
      fVar4 = IGraphics::ScreenAspect((IGraphics *)in_RDI);
      vector4_base<float>::vector4_base(&local_18,0.45,0.45,0.45,1.0);
      vector4_base<float>::vector4_base(&local_28,0.45,0.45,0.45,1.0);
      pIVar3 = Graphics(in_RDI);
      (*(pIVar3->super_IInterface)._vptr_IInterface[5])(0,0,fVar4 * 300.0,0x43960000);
      Graphics(in_RDI);
      IGraphics::TextureClear((IGraphics *)in_RDI);
      pIVar3 = Graphics(in_RDI);
      (*(pIVar3->super_IInterface)._vptr_IInterface[0x17])();
      pIVar3 = Graphics(in_RDI);
      (*(pIVar3->super_IInterface)._vptr_IInterface[0x22])(pIVar3,&local_28,&local_28,&local_18);
      IGraphics::CQuadItem::CQuadItem(&local_38,0.0,0.0,fVar4 * 300.0,300.0);
      pIVar3 = Graphics(in_RDI);
      (*(pIVar3->super_IInterface)._vptr_IInterface[0x1d])(pIVar3,&local_38,1);
      pIVar3 = Graphics(in_RDI);
      (*(pIVar3->super_IInterface)._vptr_IInterface[0x18])();
    }
  }
  else {
    bVar1 = CMenus::IsBackgroundNeeded((CMenus *)this_00);
    if (bVar1) {
      pIVar3 = Graphics(in_RDI);
      (*(pIVar3->super_IInterface)._vptr_IInterface[2])(0x3ee66666,0x3ee66666);
    }
    else {
      pIVar3 = Graphics(in_RDI);
      (*(pIVar3->super_IInterface)._vptr_IInterface[2])(0x3f800000,0x3f800000,0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameClient::StartRendering()
{
	if(Config()->m_GfxClear)
	{
		if(m_pMenus->IsBackgroundNeeded())
			Graphics()->Clear(0.45f, 0.45f, 0.45f);
		else
			Graphics()->Clear(1.0f, 1.0f, 0.0f);
	}
	else if(m_pMenus->IsBackgroundNeeded())
	{
		// render background color
		const float ScreenHeight = 300.0f;
		const float ScreenWidth = ScreenHeight * Graphics()->ScreenAspect();
		const vec4 Bottom(0.45f, 0.45f, 0.45f, 1.0f);
		const vec4 Top(0.45f, 0.45f, 0.45f, 1.0f);
		Graphics()->MapScreen(0, 0, ScreenWidth, ScreenHeight);
		Graphics()->TextureClear();
		Graphics()->QuadsBegin();
		Graphics()->SetColor4(Top, Top, Bottom, Bottom);
		IGraphics::CQuadItem QuadItem(0, 0, ScreenWidth, ScreenHeight);
		Graphics()->QuadsDrawTL(&QuadItem, 1);
		Graphics()->QuadsEnd();
	}
}